

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O0

void my_serialization_example(ChArchiveOut *marchive)

{
  double dVar1;
  mapped_type *pmVar2;
  ChVector<double> *pCVar3;
  myEmployeeBoss *this;
  myEmployeeCustomConstructor *this_00;
  char cVar4;
  char in_R9B;
  ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
  local_520;
  ChVector<double> *local_508;
  ChVector<double> *mvp2;
  ChVector<double> *mvp1;
  vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> vect_of_pointers;
  myEmployeeCustomConstructor *local_4c8;
  myEmployeeCustomConstructor *mcustomconstr;
  undefined1 local_4a8 [8];
  shared_ptr<myEmployeeBoss> null_boss;
  undefined1 local_480 [8];
  shared_ptr<myEmployee> s_boss_b;
  undefined1 local_458 [8];
  shared_ptr<myEmployeeBoss> s_boss;
  myEmployeeBoss *local_430;
  myEmployeeBoss *a_boss2;
  myEmployeeBoss *local_410;
  myEmployeeBoss *a_boss;
  char local_3f0 [8];
  ChVector<double> *a_null_ptr;
  ChVector<double> *local_3d0;
  ChVector<double> *a_vect;
  undefined1 local_3b0 [8];
  myEmployeeBoss m_boss;
  ChNameValue<chrono::ChVector<double>_> local_310;
  ChNameValue<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> local_2f8;
  ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_2e0;
  ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  local_2c8;
  ChNameValue<std::pair<int,_double>_> local_2b0;
  ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_298;
  ChNameValue<std::vector<double,_std::allocator<double>_>_> local_280;
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  ChNameValue<char[12]> local_250;
  ChNameValue<double[3]> local_238;
  ChNameValue<int> local_220;
  ChNameValue<double> local_208;
  undefined1 local_1f0 [8];
  ChQuaternion<double> m_quat;
  ChVector<double> m_vect;
  ChMatrixNM<double,_2,_3> m_matr_NM;
  int local_180 [2];
  undefined1 local_178 [8];
  ChMatrixDynamic<double> m_matr_dyn;
  key_type local_158;
  key_type local_154;
  undefined1 local_150 [8];
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  m_stlunorderedmap;
  int local_10c;
  undefined1 local_108 [8];
  pair<int,_double> m_stlpair;
  ChVector<double> local_e0;
  undefined1 local_c8 [8];
  list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> m_stllist;
  value_type_conflict1 local_a8;
  value_type_conflict1 local_a0;
  undefined1 local_98 [8];
  vector<double,_std::allocator<double>_> m_stlvector;
  allocator local_69;
  string local_68 [8];
  string m_string;
  char m_text [12];
  double m_array [3];
  double dStack_18;
  int m_int;
  double m_double;
  ChArchiveOut *marchive_local;
  
  dStack_18 = 0.123456;
  m_array[2]._4_4_ = 0xffffff85;
  m_array[1] = 16.5;
  stack0xffffffffffffffc8 = 0x402a333333333333;
  m_array[0] = 15.3;
  m_string.field_2._8_8_ = 0x7274732074736574;
  m_text[0] = 'i';
  m_text[1] = 'n';
  m_text[2] = 'g';
  m_text[3] = '\0';
  m_double = (double)marchive;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"hey! stl string",&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_98);
  local_a0 = 2.3;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_98,&local_a0);
  local_a8 = 45.3;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_98,&local_a8);
  m_stllist.super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl._M_node._M_size = 0x40509c28f5c28f5c;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_98,
             (value_type_conflict1 *)
             &m_stllist.
              super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl._M_node._M_size);
  std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::list
            ((list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)local_c8)
  ;
  chrono::ChVector<double>::ChVector(&local_e0,1.0,2.0,3.0);
  std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  push_back((list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)local_c8,
            &local_e0);
  chrono::ChVector<double>::ChVector((ChVector<double> *)&m_stlpair.second,3.0,4.0,5.0);
  std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  push_back((list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)local_c8,
            (value_type *)&m_stlpair.second);
  local_10c = 0x78;
  m_stlunorderedmap._M_h._M_single_bucket = (__node_base_ptr)0x3fefae147ae147ae;
  std::pair<int,_double>::pair<int,_double,_true>
            ((pair<int,_double> *)local_108,&local_10c,
             (double *)&m_stlunorderedmap._M_h._M_single_bucket);
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)local_150);
  local_154 = 0xc;
  pmVar2 = std::
           unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
           ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)local_150,&stack0xfffffffffffffeac);
  *pmVar2 = 11.2;
  local_158 = 0x29;
  pmVar2 = std::
           unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
           ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)local_150,&stack0xfffffffffffffea8);
  *pmVar2 = 44.8;
  m_matr_dyn.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols._4_4_
       = 0x22;
  pmVar2 = std::
           unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
           ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)local_150,
                        (key_type *)
                        ((long)&m_matr_dyn.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                m_storage.m_cols + 4));
  *pmVar2 = 33.6;
  local_180[1] = 3;
  local_180[0] = 5;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)local_178,local_180 + 1,local_180);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::fillRandom
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_178,0.0,10.0);
  Eigen::Matrix<double,_2,_3,_1,_2,_3>::Matrix((Matrix<double,_2,_3,_1,_2,_3> *)(m_vect.m_data + 2))
  ;
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::fillRandom
            ((MatrixBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)(m_vect.m_data + 2),-1.0,1.0);
  chrono::ChVector<double>::ChVector((ChVector<double> *)(m_quat.m_data + 3),0.5,0.6,0.7);
  chrono::ChQuaternion<double>::ChQuaternion((ChQuaternion<double> *)local_1f0,0.1,0.2,0.3,0.4);
  dVar1 = m_double;
  cVar4 = '\0';
  chrono::make_ChNameValue<double>
            (&local_208,"m_double",&stack0xffffffffffffffe8,"custom_double",'\0');
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,&local_208);
  chrono::ChNameValue<double>::~ChNameValue(&local_208);
  dVar1 = m_double;
  chrono::make_ChNameValue<int>(&local_220,"m_int",(int *)((long)m_array + 0x14),'\0');
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,&local_220);
  chrono::ChNameValue<int>::~ChNameValue(&local_220);
  dVar1 = m_double;
  chrono::make_ChNameValue<double[3]>(&local_238,"m_array",(double (*) [3])(m_text + 8),'\0');
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,&local_238);
  chrono::ChNameValue<double[3]>::~ChNameValue(&local_238);
  dVar1 = m_double;
  chrono::make_ChNameValue<char[12]>
            (&local_250,"m_text",(char (*) [12])((long)&m_string.field_2 + 8),'\0');
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,&local_250);
  chrono::ChNameValue<char[12]>::~ChNameValue(&local_250);
  dVar1 = m_double;
  chrono::make_ChNameValue<std::__cxx11::string>
            (&local_268,(chrono *)"m_string",(char *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0,cVar4);
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,&local_268);
  chrono::
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~ChNameValue(&local_268);
  dVar1 = m_double;
  chrono::make_ChNameValue<std::vector<double,std::allocator<double>>>
            (&local_280,(chrono *)"m_stlvector",local_98,
             (vector<double,_std::allocator<double>_> *)0x0,cVar4);
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,&local_280);
  chrono::ChNameValue<std::vector<double,_std::allocator<double>_>_>::~ChNameValue(&local_280);
  dVar1 = m_double;
  chrono::
  make_ChNameValue<std::__cxx11::list<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>>
            (&local_298,(chrono *)"m_stllist",local_c8,
             (list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)0x0,cVar4
            );
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,&local_298);
  chrono::
  ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  ::~ChNameValue(&local_298);
  dVar1 = m_double;
  chrono::make_ChNameValue<std::pair<int,double>>
            (&local_2b0,(chrono *)"m_stlpair",local_108,(pair<int,_double> *)0x0,cVar4);
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,&local_2b0);
  chrono::ChNameValue<std::pair<int,_double>_>::~ChNameValue(&local_2b0);
  dVar1 = m_double;
  chrono::
  make_ChNameValue<std::unordered_map<int,double,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,double>>>>
            (&local_2c8,(chrono *)"m_stlunorderedmap",local_150,
             (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)0x0,cVar4);
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,&local_2c8);
  chrono::
  ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  ::~ChNameValue(&local_2c8);
  dVar1 = m_double;
  chrono::make_ChNameValue<Eigen::Matrix<double,_1,_1,1,_1,_1>>
            (&local_2e0,(chrono *)"m_matr_dyn",local_178,(Matrix<double,__1,__1,_1,__1,__1> *)0x0,
             cVar4);
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,&local_2e0);
  chrono::ChNameValue<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::~ChNameValue(&local_2e0);
  dVar1 = m_double;
  chrono::make_ChNameValue<Eigen::Matrix<double,2,3,1,2,3>>
            (&local_2f8,(chrono *)"m_matr_NM",(char *)(m_vect.m_data + 2),
             (Matrix<double,_2,_3,_1,_2,_3> *)0x0,cVar4);
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,&local_2f8);
  chrono::ChNameValue<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::~ChNameValue(&local_2f8);
  dVar1 = m_double;
  chrono::make_ChNameValue<chrono::ChVector<double>>
            (&local_310,(chrono *)"m_vect",(char *)(m_quat.m_data + 3),(ChVector<double> *)0x0,cVar4
            );
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,&local_310);
  chrono::ChNameValue<chrono::ChVector<double>_>::~ChNameValue(&local_310);
  dVar1 = m_double;
  cVar4 = '\x01';
  chrono::make_ChNameValue<chrono::ChQuaternion<double>>
            ((ChNameValue<chrono::ChQuaternion<double>_> *)((long)&m_boss.slave.name.field_2 + 8),
             (chrono *)"m_quat",local_1f0,(ChQuaternion<double> *)"m_quaternion",(char *)0x1,in_R9B)
  ;
  chrono::ChArchiveOut::operator<<
            ((ChArchiveOut *)dVar1,
             (ChNameValue<chrono::ChQuaternion<double>_> *)((long)&m_boss.slave.name.field_2 + 8));
  chrono::ChNameValue<chrono::ChQuaternion<double>_>::~ChNameValue
            ((ChNameValue<chrono::ChQuaternion<double>_> *)((long)&m_boss.slave.name.field_2 + 8));
  myEmployeeBoss::myEmployeeBoss((myEmployeeBoss *)local_3b0,0x35,12000.34,true);
  dVar1 = m_double;
  m_boss.super_myEmployee.wages._0_4_ = 4;
  chrono::make_ChNameValue<myEmployeeBoss>
            ((ChNameValue<myEmployeeBoss> *)&a_vect,"m_boss",(myEmployeeBoss *)local_3b0,'\0');
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,(ChNameValue<myEmployeeBoss> *)&a_vect);
  chrono::ChNameValue<myEmployeeBoss>::~ChNameValue((ChNameValue<myEmployeeBoss> *)&a_vect);
  pCVar3 = (ChVector<double> *)operator_new(0x18);
  chrono::ChVector<double>::ChVector(pCVar3,1.0,2.0,3.0);
  dVar1 = m_double;
  local_3d0 = pCVar3;
  chrono::make_ChNameValue<chrono::ChVector<double>*>
            ((ChNameValue<chrono::ChVector<double>_*> *)&a_null_ptr,(chrono *)"a_vect",
             (char *)&local_3d0,(ChVector<double> **)0x0,cVar4);
  chrono::ChArchiveOut::operator<<
            ((ChArchiveOut *)dVar1,(ChNameValue<chrono::ChVector<double>_*> *)&a_null_ptr);
  chrono::ChNameValue<chrono::ChVector<double>_*>::~ChNameValue
            ((ChNameValue<chrono::ChVector<double>_*> *)&a_null_ptr);
  if (local_3d0 != (ChVector<double> *)0x0) {
    operator_delete(local_3d0,0x18);
  }
  dVar1 = m_double;
  local_3f0[0] = '\0';
  local_3f0[1] = '\0';
  local_3f0[2] = '\0';
  local_3f0[3] = '\0';
  local_3f0[4] = '\0';
  local_3f0[5] = '\0';
  local_3f0[6] = '\0';
  local_3f0[7] = '\0';
  chrono::make_ChNameValue<chrono::ChVector<double>*>
            ((ChNameValue<chrono::ChVector<double>_*> *)&a_boss,(chrono *)"a_null_ptr",local_3f0,
             (ChVector<double> **)0x0,cVar4);
  chrono::ChArchiveOut::operator<<
            ((ChArchiveOut *)dVar1,(ChNameValue<chrono::ChVector<double>_*> *)&a_boss);
  chrono::ChNameValue<chrono::ChVector<double>_*>::~ChNameValue
            ((ChNameValue<chrono::ChVector<double>_*> *)&a_boss);
  this = (myEmployeeBoss *)operator_new(0x88);
  myEmployeeBoss::myEmployeeBoss(this,0x40,22356.0,false);
  dVar1 = m_double;
  (this->slave).age = 0x18;
  local_410 = this;
  chrono::make_ChNameValue<myEmployeeBoss*>
            ((ChNameValue<myEmployeeBoss_*> *)&a_boss2,(chrono *)"a_boss",(char *)&local_410,
             (myEmployeeBoss **)0x0,cVar4);
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,(ChNameValue<myEmployeeBoss_*> *)&a_boss2);
  chrono::ChNameValue<myEmployeeBoss_*>::~ChNameValue((ChNameValue<myEmployeeBoss_*> *)&a_boss2);
  dVar1 = m_double;
  local_430 = local_410;
  chrono::make_ChNameValue<myEmployeeBoss*>
            ((ChNameValue<myEmployeeBoss_*> *)
             &s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (chrono *)"a_boss2",(char *)&local_430,(myEmployeeBoss **)0x0,cVar4);
  chrono::ChArchiveOut::operator<<
            ((ChArchiveOut *)dVar1,
             (ChNameValue<myEmployeeBoss_*> *)
             &s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  chrono::ChNameValue<myEmployeeBoss_*>::~ChNameValue
            ((ChNameValue<myEmployeeBoss_*> *)
             &s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  chrono_types::make_shared<myEmployeeBoss,_0>();
  dVar1 = m_double;
  chrono::make_ChNameValue<std::shared_ptr<myEmployeeBoss>>
            ((ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)
             &s_boss_b.super___shared_ptr<myEmployee,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (chrono *)"s_boss",local_458,(shared_ptr<myEmployeeBoss> *)0x0,cVar4);
  chrono::ChArchiveOut::operator<<
            ((ChArchiveOut *)dVar1,
             (ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)
             &s_boss_b.super___shared_ptr<myEmployee,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  chrono::ChNameValue<std::shared_ptr<myEmployeeBoss>_>::~ChNameValue
            ((ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)
             &s_boss_b.super___shared_ptr<myEmployee,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<myEmployee>::shared_ptr<myEmployeeBoss,void>
            ((shared_ptr<myEmployee> *)local_480,(shared_ptr<myEmployeeBoss> *)local_458);
  dVar1 = m_double;
  chrono::make_ChNameValue<std::shared_ptr<myEmployee>>
            ((ChNameValue<std::shared_ptr<myEmployee>_> *)
             &null_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (chrono *)"s_boss_b",(char *)local_480,(shared_ptr<myEmployee> *)0x0,cVar4);
  chrono::ChArchiveOut::operator<<
            ((ChArchiveOut *)dVar1,
             (ChNameValue<std::shared_ptr<myEmployee>_> *)
             &null_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  chrono::ChNameValue<std::shared_ptr<myEmployee>_>::~ChNameValue
            ((ChNameValue<std::shared_ptr<myEmployee>_> *)
             &null_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<myEmployeeBoss>::shared_ptr((shared_ptr<myEmployeeBoss> *)local_4a8);
  dVar1 = m_double;
  chrono::make_ChNameValue<std::shared_ptr<myEmployeeBoss>>
            ((ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)&mcustomconstr,(chrono *)"null_boss",
             (char *)local_4a8,(shared_ptr<myEmployeeBoss> *)0x0,cVar4);
  chrono::ChArchiveOut::operator<<
            ((ChArchiveOut *)dVar1,(ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)&mcustomconstr);
  chrono::ChNameValue<std::shared_ptr<myEmployeeBoss>_>::~ChNameValue
            ((ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)&mcustomconstr);
  this_00 = (myEmployeeCustomConstructor *)operator_new(0x50);
  myEmployeeCustomConstructor::myEmployeeCustomConstructor(this_00,3,40.0);
  dVar1 = m_double;
  local_4c8 = this_00;
  chrono::make_ChNameValue<myEmployeeCustomConstructor*>
            ((ChNameValue<myEmployeeCustomConstructor_*> *)
             &vect_of_pointers.
              super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(chrono *)"mcustomconstr",
             (char *)&local_4c8,(myEmployeeCustomConstructor **)0x0,cVar4);
  chrono::ChArchiveOut::operator<<
            ((ChArchiveOut *)dVar1,
             (ChNameValue<myEmployeeCustomConstructor_*> *)
             &vect_of_pointers.
              super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  chrono::ChNameValue<myEmployeeCustomConstructor_*>::~ChNameValue
            ((ChNameValue<myEmployeeCustomConstructor_*> *)
             &vect_of_pointers.
              super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::vector
            ((vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> *)
             &mvp1);
  pCVar3 = (ChVector<double> *)operator_new(0x18);
  chrono::ChVector<double>::ChVector(pCVar3,1.0,2.0,3.0);
  mvp2 = pCVar3;
  pCVar3 = (ChVector<double> *)operator_new(0x18);
  chrono::ChVector<double>::ChVector(pCVar3,7.0,8.0,7.0);
  local_508 = pCVar3;
  std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::push_back
            ((vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> *)
             &mvp1,&mvp2);
  std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::push_back
            ((vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> *)
             &mvp1,&local_508);
  chrono::ChArchiveOut::UnbindExternalPointer((ChArchiveOut *)m_double,mvp2,0x3e9);
  dVar1 = m_double;
  chrono::
  make_ChNameValue<std::vector<chrono::ChVector<double>*,std::allocator<chrono::ChVector<double>*>>>
            (&local_520,(chrono *)"vect_of_pointers",(char *)&mvp1,
             (vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> *)0x0,
             cVar4);
  chrono::ChArchiveOut::operator<<((ChArchiveOut *)dVar1,&local_520);
  chrono::
  ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
  ::~ChNameValue(&local_520);
  if (local_410 != (myEmployeeBoss *)0x0) {
    (*(local_410->super_myEmployee)._vptr_myEmployee[1])();
  }
  std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::~vector
            ((vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> *)
             &mvp1);
  std::shared_ptr<myEmployeeBoss>::~shared_ptr((shared_ptr<myEmployeeBoss> *)local_4a8);
  std::shared_ptr<myEmployee>::~shared_ptr((shared_ptr<myEmployee> *)local_480);
  std::shared_ptr<myEmployeeBoss>::~shared_ptr((shared_ptr<myEmployeeBoss> *)local_458);
  myEmployeeBoss::~myEmployeeBoss((myEmployeeBoss *)local_3b0);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_1,__1,__1> *)local_178);
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)local_150);
  std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::~list
            ((list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)local_c8)
  ;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_98);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void my_serialization_example(ChArchiveOut& marchive)
{
        // All basic primitives (strings, int,etc.), plus and objects that has
        // an ArchiveOUT() function defined can be serialized in archives.      

        // Write from transient data into persistent binary file
        double m_double = 0.123456;
        int m_int = -123;
        double m_array[] = {13.1, 15.3, 16.5};
        char m_text[] = "test string"; // better use std::string
        std::string m_string = "hey! stl string";
        std::vector< double > m_stlvector; 
        m_stlvector.push_back (2.3); 
        m_stlvector.push_back (45.3);
        m_stlvector.push_back (66.44);
        std::list< ChVector<> > m_stllist; 
        m_stllist.push_back ( ChVector<>(1,2,3) ); 
        m_stllist.push_back ( ChVector<>(3,4,5) );
        std::pair<int, double> m_stlpair(120, 0.99);
        std::unordered_map<int, double> m_stlunorderedmap;
        m_stlunorderedmap[12]=11.2;
        m_stlunorderedmap[41]=44.8;
        m_stlunorderedmap[34]=33.6; 
        ChMatrixDynamic<double> m_matr_dyn(3, 5);
        m_matr_dyn.fillRandom(0, 10);
		ChMatrixNM<double,2,3> m_matr_NM;
        m_matr_NM.fillRandom(-1, +1);
        ChVector<> m_vect(0.5, 0.6, 0.7);
        ChQuaternion<> m_quat(0.1, 0.2, 0.3, 0.4);
 
        marchive << CHNVP(m_double,"custom_double");  // store data n.1      
        marchive << CHNVP(m_int);     // store data n.2 
        marchive << CHNVP(m_array);   // store data n.3
        marchive << CHNVP(m_text);    // store data n....
        marchive << CHNVP(m_string);  
        marchive << CHNVP(m_stlvector);
        marchive << CHNVP(m_stllist);
        marchive << CHNVP(m_stlpair);
        marchive << CHNVP(m_stlunorderedmap);
        marchive << CHNVP(m_matr_dyn);
		marchive << CHNVP(m_matr_NM);
        marchive << CHNVP(m_vect);
        marchive << CHNVP(m_quat, "m_quaternion", NVP_TRACK_OBJECT);  
        
        // Also store a c++ object 
        // In order to use this feature, the classes must implement 
        // ArchiveIN and ArchiveOUT functions.
        myEmployeeBoss m_boss(53, 12000.34, true);
        m_boss.body = FAT;
        marchive << CHNVP(m_boss);    

        // Also store a c++ objects referenced by pointer(s).
        // One could have multiple pointers to the same object: 
        // the serialization of pointers takes care of redundancy.
        // In order to use this feature, the classes must implement 
        // ArchiveIN and ArchiveOUT functions.
        ChVector<>* a_vect = new ChVector<>(1,2,3); 
        marchive << CHNVP(a_vect);
        delete a_vect;

        // Null pointers can be serialized. They will be deserialized as null.
        ChVector<>* a_null_ptr = 0; 
        marchive << CHNVP(a_null_ptr);

        // Also store c++ objects referenced by pointer, using the
        // class abstraction (class factory) mechanism, so that it
        // can be loaded later even if we do not know if it was an object of
        // class 'myEmployee' or specialized class 'myEmployeeBoss'...
        // In order to use this feature, classes must use the CH_FACTORY_REGISTER macros, 
        // and must implement ArchiveIN() and ArchiveOUT().
        myEmployeeBoss* a_boss = new myEmployeeBoss(64, 22356, false);
        a_boss->slave.age = 24;
        marchive << CHNVP(a_boss);  //  object was referenced by pointer.

        // If another pointer shares the same object instance, you can serialize
        // it too without worrying, because the serialization system will save only
        // the first copy and following copies will just use references.

        myEmployeeBoss* a_boss2 = a_boss;
        marchive << CHNVP(a_boss2);  //  object was referenced by pointer.

        // Also store c++ objects referenced by shared pointers.
        // If classes of pointed objects used CH_FACTORY_REGISTER, class abstraction
        // will be automatically used.
        auto s_boss = chrono_types::make_shared<myEmployeeBoss>();
        marchive << CHNVP(s_boss);  //  object was referenced by shared pointer.

        // Serialize a shared pointer pointing to the same shared resource of s_boss. 
        // Note, base class works fine too, as polymorphic object.
        std::shared_ptr<myEmployee> s_boss_b(s_boss);
        marchive << CHNVP(s_boss_b);

        // Serialize null shared pointer
        std::shared_ptr<myEmployeeBoss> null_boss;
        marchive << CHNVP(null_boss); 

        // Serialize an object with non-default constructor:
        myEmployeeCustomConstructor* mcustomconstr = new myEmployeeCustomConstructor(3,40);
        marchive << CHNVP(mcustomconstr); 

        // Serialize an object where some pointers are un-linked as external, marking them with unique IDs
        std::vector<ChVector<>*> vect_of_pointers;
        ChVector<>* mvp1 = new ChVector<>(1,2,3);
        ChVector<>* mvp2 = new ChVector<>(7,8,7);
        vect_of_pointers.push_back(mvp1);
        vect_of_pointers.push_back(mvp2);
        // define that some object should not be serialized, but rather marked with ID for later rebinding
        marchive.UnbindExternalPointer(mvp1, 1001); // use unique identifier > 0
        marchive << CHNVP(vect_of_pointers);

        delete a_boss;
}